

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int checkroots_cerr(double *phi,int *p,double *theta,int *q,double *PHI,int *P,double *THETA,int *Q)

{
  int iVar1;
  
  if ((0 < *p) && (iVar1 = archeck(*p,phi), iVar1 == 0)) {
    puts("\nnon-stationary AR part");
    return 10;
  }
  if (0 < *q) {
    invertroot(*q,theta);
  }
  if ((0 < *P) && (iVar1 = archeck(*P,PHI), iVar1 == 0)) {
    puts("\nnon-stationary seasonal AR part");
    return 0xc;
  }
  if (0 < *Q) {
    invertroot(*Q,THETA);
  }
  return 1;
}

Assistant:

static int checkroots_cerr(double *phi, int *p, double *theta, int *q, double *PHI, int *P, double *THETA, int *Q) {
	int ret,out;

	out = 1;

	if (*p > 0) {
		ret = archeck(*p,phi);
		if (!ret) {
			out = 10;
			printf("\nnon-stationary AR part\n");
			return out;
		}
	}

	if (*q > 0) {
		invertroot(*q,theta);
	}

	if (*P == *P) {
		if (*P > 0) {
			ret = archeck(*P,PHI);
			if (!ret) {
				out = 12;
				printf("\nnon-stationary seasonal AR part\n");
				return out;
			}
		}
	}

	if (*Q == *Q) {
		if (*Q > 0) {
			invertroot(*Q,THETA);
		}
	}

	return out;

}